

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

void * Sat_ProofCore(sat_solver2 *s)

{
  double b;
  double dVar1;
  sat_solver2 *s_local;
  
  if (s->pPrf1 == (Vec_Set_t *)0x0) {
    if (s->pPrf2 == (Prf_Man_t *)0x0) {
      s_local = (sat_solver2 *)0x0;
    }
    else {
      dVar1 = s->dPrfMemory;
      b = Prf_ManMemory(s->pPrf2);
      dVar1 = Abc_MaxDouble(dVar1,b);
      s->dPrfMemory = dVar1;
      s_local = (sat_solver2 *)Prf_ManUnsatCore(s->pPrf2);
    }
  }
  else {
    s_local = (sat_solver2 *)Proof_DeriveCore(s->pPrf1,s->hProofLast);
  }
  return s_local;
}

Assistant:

void * Sat_ProofCore( sat_solver2 * s )
{
    extern void * Proof_DeriveCore( Vec_Set_t * vProof, int hRoot );
    if ( s->pPrf1 )
        return Proof_DeriveCore( s->pPrf1, s->hProofLast );
    if ( s->pPrf2 )
    {
        s->dPrfMemory = Abc_MaxDouble( s->dPrfMemory, Prf_ManMemory(s->pPrf2) );
        return Prf_ManUnsatCore( s->pPrf2 );
    }
    return NULL;
}